

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

string * cmQtAutoGenerator::SettingsFind(string *__return_storage_ptr__,string *content,char *key)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  size_type posE;
  size_type pos;
  allocator<char> local_41;
  string local_40 [8];
  string prefix;
  char *key_local;
  string *content_local;
  
  prefix.field_2._8_8_ = key;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,key,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::operator+=(local_40,':');
  lVar1 = std::__cxx11::string::find((string *)content,(ulong)local_40);
  if (lVar1 != -1) {
    lVar2 = std::__cxx11::string::size();
    uVar3 = std::__cxx11::string::size();
    if ((((ulong)(lVar2 + lVar1) < uVar3) &&
        (uVar3 = std::__cxx11::string::find((char)content,10), uVar3 != 0xffffffffffffffff)) &&
       (uVar3 != lVar2 + lVar1)) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)content);
      goto LAB_001f2ddc;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
LAB_001f2ddc:
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerator::SettingsFind(std::string const& content,
                                            const char* key)
{
  std::string prefix(key);
  prefix += ':';
  std::string::size_type pos = content.find(prefix);
  if (pos != std::string::npos) {
    pos += prefix.size();
    if (pos < content.size()) {
      std::string::size_type posE = content.find('\n', pos);
      if ((posE != std::string::npos) && (posE != pos)) {
        return content.substr(pos, posE - pos);
      }
    }
  }
  return std::string();
}